

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_on_connection_window_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((frame->priority).pri_spec.stream_id == 0) {
    session_local._4_4_ =
         session_handle_invalid_connection
                   (session,frame,-0x1f9,"WINDOW_UPDATE: window_size_increment == 0");
  }
  else if (0x7fffffff - (frame->priority).pri_spec.stream_id < session->remote_window_size) {
    session_local._4_4_ = session_handle_invalid_connection(session,frame,-0x20c,(char *)0x0);
  }
  else {
    session->remote_window_size = (frame->priority).pri_spec.stream_id + session->remote_window_size
    ;
    session_local._4_4_ = session_call_on_frame_received(session,frame);
  }
  return session_local._4_4_;
}

Assistant:

static int
session_on_connection_window_update_received(nghttp2_session *session,
                                             nghttp2_frame *frame) {
  /* Handle connection-level flow control */
  if (frame->window_update.window_size_increment == 0) {
    return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "WINDOW_UPDATE: window_size_increment == 0");
  }

  if (NGHTTP2_MAX_WINDOW_SIZE - frame->window_update.window_size_increment <
      session->remote_window_size) {
    return session_handle_invalid_connection(session, frame,
                                             NGHTTP2_ERR_FLOW_CONTROL, NULL);
  }
  session->remote_window_size += frame->window_update.window_size_increment;

  return session_call_on_frame_received(session, frame);
}